

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void lengthFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  byte bVar1;
  int iVar2;
  uchar *puStack_30;
  uchar c;
  uchar *z0;
  uchar *z;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  iVar2 = sqlite3_value_type(*argv);
  if (1 < iVar2 - 1U) {
    if (iVar2 == 3) {
      puStack_30 = sqlite3_value_text(*argv);
      z0 = puStack_30;
      if (puStack_30 == (uchar *)0x0) {
        return;
      }
      while (bVar1 = *z0, bVar1 != 0) {
        z0 = z0 + 1;
        if (0xbf < bVar1) {
          for (; (*z0 & 0xc0) == 0x80; z0 = z0 + 1) {
            puStack_30 = puStack_30 + 1;
          }
        }
      }
      sqlite3_result_int(context,(int)z0 - (int)puStack_30);
      return;
    }
    if (iVar2 != 4) {
      sqlite3_result_null(context);
      return;
    }
  }
  iVar2 = sqlite3_value_bytes(*argv);
  sqlite3_result_int(context,iVar2);
  return;
}

Assistant:

static void lengthFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  switch( sqlite3_value_type(argv[0]) ){
    case SQLITE_BLOB:
    case SQLITE_INTEGER:
    case SQLITE_FLOAT: {
      sqlite3_result_int(context, sqlite3_value_bytes(argv[0]));
      break;
    }
    case SQLITE_TEXT: {
      const unsigned char *z = sqlite3_value_text(argv[0]);
      const unsigned char *z0;
      unsigned char c;
      if( z==0 ) return;
      z0 = z;
      while( (c = *z)!=0 ){
        z++;
        if( c>=0xc0 ){
          while( (*z & 0xc0)==0x80 ){ z++; z0++; }
        }
      }
      sqlite3_result_int(context, (int)(z-z0));
      break;
    }
    default: {
      sqlite3_result_null(context);
      break;
    }
  }
}